

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

void __thiscall
LinkedObjectFile::push_back_word_to_segment(LinkedObjectFile *this,uint32_t word,int segment)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  uint local_4;
  
  uVar3 = (ulong)segment;
  pvVar1 = (this->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->words_by_seg).
                 super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    std::vector<LinkedWord,std::allocator<LinkedWord>>::emplace_back<unsigned_int&>
              ((vector<LinkedWord,std::allocator<LinkedWord>> *)(pvVar1 + uVar3),&local_4);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void LinkedObjectFile::push_back_word_to_segment(uint32_t word, int segment) {
  words_by_seg.at(segment).emplace_back(word);
}